

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv4Transmitter::Init(RTPUDPv4Transmitter *this,bool tsafe)

{
  int iVar1;
  
  iVar1 = -2;
  if (this->init != false) {
    iVar1 = -0x47;
  }
  if (!tsafe && this->init == false) {
    this->init = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::Init(bool tsafe)
{
	if (init)
		return ERR_RTP_UDPV4TRANS_ALREADYINIT;
	
#ifdef RTP_SUPPORT_THREAD
	threadsafe = tsafe;
	if (threadsafe)
	{
		int status;
		
		status = mainmutex.Init();
		if (status < 0)
			return ERR_RTP_UDPV4TRANS_CANTINITMUTEX;
		status = waitmutex.Init();
		if (status < 0)
			return ERR_RTP_UDPV4TRANS_CANTINITMUTEX;
	}
#else
	if (tsafe)
		return ERR_RTP_NOTHREADSUPPORT;
#endif // RTP_SUPPORT_THREAD

	init = true;
	return 0;
}